

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitiveIntegers.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_primitiveInteger_unsigned_printString(sysbvm_context_t *context,uint64_t integer)

{
  sysbvm_tuple_t sVar1;
  size_t stringSize;
  char buffer [64];
  
  for (stringSize = 0; stringSize == 0 || integer != 0; stringSize = stringSize + 1) {
    buffer[stringSize] = (byte)(integer % 10) | 0x30;
    integer = integer / 10;
  }
  buffer[stringSize] = '\0';
  sVar1 = sysbvm_string_createWithReversedString(context,stringSize,buffer);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_primitiveInteger_unsigned_printString(sysbvm_context_t *context, uint64_t integer)
{
    char buffer[64];
    size_t bufferSize = 0;

    // Extract each one of the digits.
    uint64_t value = integer;
    while (value != 0 || bufferSize == 0)
    {
        buffer[bufferSize++] = '0' + (value % 10);
        value /= 10;
    }

    buffer[bufferSize] = 0;
    return sysbvm_string_createWithReversedString(context, bufferSize, buffer);
}